

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_add_elements_raw_output_at
              (wally_tx *tx,uint32_t index,uchar *script,size_t script_len,uchar *asset,
              size_t asset_len,uchar *value,size_t value_len,uchar *nonce,size_t nonce_len,
              uchar *surjectionproof,size_t surjectionproof_len,uchar *rangeproof,
              size_t rangeproof_len,uint32_t flags)

{
  int iVar1;
  size_t asset_len_local;
  uchar *asset_local;
  size_t script_len_local;
  uchar *script_local;
  uint32_t index_local;
  wally_tx *tx_local;
  
  iVar1 = tx_add_elements_raw_output_at
                    (tx,index,0xffffffffffffffff,script,script_len,asset,asset_len,value,value_len,
                     nonce,nonce_len,surjectionproof,surjectionproof_len,rangeproof,rangeproof_len,
                     flags,true);
  return iVar1;
}

Assistant:

int wally_tx_add_elements_raw_output_at(
    struct wally_tx *tx, uint32_t index,
    const unsigned char *script, size_t script_len,
    const unsigned char *asset, size_t asset_len,
    const unsigned char *value, size_t value_len,
    const unsigned char *nonce, size_t nonce_len,
    const unsigned char *surjectionproof, size_t surjectionproof_len,
    const unsigned char *rangeproof, size_t rangeproof_len,
    uint32_t flags)
{
    return tx_add_elements_raw_output_at(tx, index, -1,
                                         script, script_len,
                                         asset, asset_len,
                                         value, value_len,
                                         nonce, nonce_len,
                                         surjectionproof, surjectionproof_len,
                                         rangeproof, rangeproof_len,
                                         flags, true);
}